

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O1

void anon_unknown.dwarf_234219::testWriteRead
               (int partNumber,int runCount,int randomReadCount,string *tempDir)

{
  WritingTaskData *pWVar1;
  WritingTaskData *pWVar2;
  ulong *puVar3;
  float fVar4;
  pointer pcVar5;
  void *pvVar6;
  FrameBuffer *pFVar7;
  size_type sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Header *pHVar11;
  Header *pHVar12;
  Array2D<Imf_3_4::FrameBuffer> *pAVar13;
  char cVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  undefined4 uVar22;
  int iVar23;
  int iVar24;
  ostream *poVar25;
  char *pcVar26;
  TileDescription *pTVar27;
  TiledOutputPart *this;
  ulong uVar28;
  ulong *puVar29;
  OutputPart *this_00;
  ThreadPool *pTVar30;
  pointer __dest;
  Task *pTVar31;
  undefined8 *puVar32;
  undefined8 *puVar33;
  float *pfVar34;
  float *pfVar35;
  int *piVar36;
  ChannelList *this_01;
  ChannelList *pCVar37;
  ulong *puVar38;
  _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  *p_Var39;
  Header *this_02;
  size_type sVar40;
  ulong uVar41;
  ulong uVar42;
  uint uVar43;
  size_type *psVar44;
  long lVar45;
  long *plVar46;
  size_type *psVar47;
  pointer ppWVar48;
  WritingTaskData *pWVar49;
  long lVar50;
  ulong uVar51;
  pointer ppWVar52;
  size_t sVar53;
  bool bVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  list;
  Array2D<unsigned_int> uintData;
  int numYLevel;
  MultiPartOutputFile file;
  Array2D<float> floatData;
  Array2D<Imath_3_2::half> halfData;
  Array<Imf_3_4::Array2D<Imf_3_4::FrameBuffer>_> tiledFrameBuffers;
  string fn;
  vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> frameBuffers;
  vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
  taskList;
  int *numXTiles;
  vector<void_*,_std::allocator<void_*>_> parts;
  pointer local_3a0;
  undefined1 local_388 [16];
  pointer local_378;
  pointer local_368;
  uint local_35c;
  Array2D<unsigned_int> local_358;
  ulong local_340;
  _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  *local_338;
  uint local_32c;
  pointer local_328;
  ThreadPool *local_320;
  int local_318 [3];
  uint local_30c;
  pointer local_308;
  long local_300;
  int *local_2f8 [2];
  Array2D<Imath_3_2::half> local_2e8;
  Array2D<Imath_3_2::half> local_2c8;
  Array<Imf_3_4::Array2D<Imf_3_4::FrameBuffer>_> local_2a8;
  size_type *local_298;
  long *local_290 [2];
  long local_280 [2];
  vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> local_270;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_258;
  int local_234;
  int local_230;
  int local_22c;
  WritingTaskData *local_228;
  long lStack_220;
  long local_218;
  vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  local_210;
  size_type *local_1f8;
  size_type *local_1f0;
  size_t local_1e8;
  size_type *local_1e0;
  size_type *local_1d8;
  size_type *local_1d0;
  size_t local_1c8;
  ulong local_1c0;
  undefined1 local_1b8 [8];
  undefined8 uStack_1b0;
  _Base_ptr local_1a8;
  _Base_ptr local_1a0;
  _Base_ptr local_198;
  size_t local_190;
  ios_base local_138 [264];
  
  local_230 = randomReadCount;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing file with ",0x12);
  local_35c = partNumber;
  poVar25 = (ostream *)std::ostream::operator<<(&std::cout,partNumber);
  std::__ostream_insert<char,std::char_traits<char>>(poVar25," part(s).",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar25 + -0x18) + (char)poVar25);
  std::ostream::put((char)poVar25);
  std::ostream::flush();
  std::ostream::flush();
  local_290[0] = local_280;
  pcVar5 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_290,pcVar5,pcVar5 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)local_290);
  local_234 = runCount;
  if (0 < runCount) {
    local_340 = (ulong)local_35c;
    local_1c0 = local_340 * 0x18 + 8;
    local_1c8 = ((local_340 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18;
    iVar15 = 0;
    do {
      local_2c8._data = (half *)0x0;
      local_2c8._sizeX = 0;
      local_2c8._sizeY = 0;
      local_2e8._data = (half *)0x0;
      local_2e8._sizeX = 0;
      local_2e8._sizeY = 0;
      local_358._data = (uint *)0x0;
      local_358._sizeX = 0;
      local_358._sizeY = 0;
      local_22c = iVar15;
      fillPixels<unsigned_int>(&local_358,0xc5,0x107);
      fillPixels<Imath_3_2::half>(&local_2c8,0xc5,0x107);
      fillPixels<float>((Array2D<float> *)&local_2e8,0xc5,0x107);
      uVar28 = local_1c0;
      local_298 = (size_type *)operator_new__(local_1c0);
      sVar53 = local_1c8;
      uVar42 = local_340;
      *local_298 = local_340;
      local_1e0 = local_298 + 1;
      memset(local_1e0,0,local_1c8);
      local_1f0 = (size_type *)operator_new__(uVar28);
      *local_1f0 = uVar42;
      local_1d8 = local_1f0 + 1;
      memset(local_1d8,0,sVar53);
      local_1f8 = (size_type *)operator_new__(uVar28);
      *local_1f8 = uVar42;
      local_1d0 = local_1f8 + 1;
      memset(local_1d0,0,sVar53);
      local_228 = (WritingTaskData *)0x0;
      lStack_220 = 0;
      local_218 = 0;
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::pixelTypes,uVar42);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::partTypes,local_340);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::levelModes,local_340);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Generating headers and data ",0x1c);
      std::ostream::flush();
      pHVar12 = DAT_001e9d30;
      pHVar11 = (anonymous_namespace)::headers;
      this_02 = (anonymous_namespace)::headers;
      if (DAT_001e9d30 != (anonymous_namespace)::headers) {
        do {
          Imf_3_4::Header::~Header(this_02);
          this_02 = this_02 + 0x38;
        } while (this_02 != pHVar12);
        DAT_001e9d30 = pHVar11;
      }
      if (0 < (int)local_35c) {
        sVar40 = 0;
        do {
          local_1b8 = (undefined1  [8])0x0;
          Imf_3_4::Header::Header
                    ((Header *)&local_270,0xc5,0x107,1.0,(Vec2 *)local_1b8,1.0,INCREASING_Y,
                     ZIP_COMPRESSION);
          iVar15 = random_int(3);
          iVar16 = random_int(2);
          *(int *)((anonymous_namespace)::pixelTypes + sVar40 * 4) = iVar15;
          *(int *)((anonymous_namespace)::partTypes + sVar40 * 4) = iVar16;
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          iVar21 = (int)sVar40;
          std::ostream::operator<<(&local_1a8,iVar21);
          std::__cxx11::stringbuf::str();
          Imf_3_4::Header::setName((string *)&local_270);
          if ((TiledOutputPart *)local_388._0_8_ != (TiledOutputPart *)&local_378) {
            operator_delete((void *)local_388._0_8_,(long)local_378 + 1);
          }
          if (iVar15 == 0) {
            pcVar26 = (char *)Imf_3_4::Header::channels();
            Imf_3_4::Channel::Channel((Channel *)local_388,UINT,1,1,false);
            Imf_3_4::ChannelList::insert(pcVar26,(Channel *)"UINT");
          }
          else if (iVar15 == 1) {
            pcVar26 = (char *)Imf_3_4::Header::channels();
            Imf_3_4::Channel::Channel((Channel *)local_388,FLOAT,1,1,false);
            Imf_3_4::ChannelList::insert(pcVar26,(Channel *)"FLOAT");
          }
          else if (iVar15 == 2) {
            pcVar26 = (char *)Imf_3_4::Header::channels();
            Imf_3_4::Channel::Channel((Channel *)local_388,HALF,1,1,false);
            Imf_3_4::ChannelList::insert(pcVar26,(Channel *)"HALF");
          }
          bVar54 = true;
          if (((iVar16 == 0) || (iVar16 == 1)) &&
             (Imf_3_4::Header::setType((string *)&local_270), iVar16 == 1)) {
            iVar15 = random_int(0xc5);
            iVar17 = random_int(0x107);
            uVar18 = random_int(3);
            *(uint *)((anonymous_namespace)::levelModes + sVar40 * 4) = uVar18;
            local_388._8_4_ = 3;
            if (uVar18 < 3) {
              local_388._8_4_ = uVar18;
            }
            local_388._4_4_ = iVar17 + 1;
            local_388._0_4_ = iVar15 + 1;
            local_388._12_4_ = 0;
            Imf_3_4::Header::setTileDescription((TileDescription *)&local_270);
            bVar54 = uVar18 != 1;
          }
          if (iVar16 == 0) {
            iVar15 = 0x107;
            do {
              local_388._0_4_ = iVar21;
              std::
              vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
              ::push_back((vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                           *)&local_228,(value_type *)local_388);
              iVar15 = iVar15 + -1;
            } while (iVar15 != 0);
          }
          else {
            pTVar27 = (TileDescription *)Imf_3_4::Header::tileDescription();
            Imf_3_4::precalculateTileInfo
                      (pTVar27,0,0xc4,0,0x106,(int **)&local_210,local_2f8,(int *)&local_2a8,
                       local_318);
            if (0 < (int)local_2a8._size) {
              lVar50 = 0;
              do {
                if (0 < local_318[0]) {
                  lVar45 = 0;
                  do {
                    if ((!(bool)(~bVar54 & lVar50 != lVar45)) &&
                       (0 < *(int *)((long)local_210.
                                           super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar50 * 4)))
                    {
                      iVar15 = 0;
                      do {
                        if (0 < local_2f8[0][lVar45]) {
                          iVar16 = 0;
                          do {
                            local_388._0_8_ = CONCAT44(iVar15,iVar21);
                            local_388._12_4_ = (int)lVar50;
                            local_388._8_4_ = iVar16;
                            local_378 = (pointer)CONCAT44(local_378._4_4_,(int)lVar45);
                            std::
                            vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                            ::push_back((vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                                         *)&local_228,(value_type *)local_388);
                            iVar16 = iVar16 + 1;
                          } while (iVar16 < local_2f8[0][lVar45]);
                        }
                        iVar15 = iVar15 + 1;
                      } while (iVar15 < *(int *)((long)local_210.
                                                                                                              
                                                  super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                lVar50 * 4));
                    }
                    lVar45 = lVar45 + 1;
                  } while (lVar45 < local_318[0]);
                }
                lVar50 = lVar50 + 1;
              } while (lVar50 < (int)local_2a8._size);
            }
            if (local_210.
                super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete__(local_210.
                                super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_2f8[0] != (int *)0x0) {
              operator_delete__(local_2f8[0]);
            }
          }
          std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
                    ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
                     &(anonymous_namespace)::headers,(value_type *)&local_270);
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
          Imf_3_4::Header::~Header((Header *)&local_270);
          sVar40 = sVar40 + 1;
        } while (sVar40 != local_340);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Shuffling ",10);
      pWVar49 = local_228;
      ppWVar48 = (pointer)((lStack_220 - (long)local_228 >> 2) * -0x3333333333333333);
      poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar25," tasks ",7);
      std::ostream::flush();
      iVar15 = (int)ppWVar48;
      uVar42 = (ulong)ppWVar48 & 0xffffffff;
      if (0 < iVar15) {
        do {
          iVar19 = random_int(iVar15);
          iVar20 = random_int(iVar15);
          iVar16 = pWVar49[iVar19].ly;
          local_1a8 = (_Base_ptr)CONCAT44(local_1a8._4_4_,iVar16);
          pWVar1 = pWVar49 + iVar19;
          local_1b8._0_4_ = pWVar1->partNumber;
          local_1b8._4_4_ = pWVar1->tx;
          uStack_1b0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&pWVar1->ty;
          pWVar49[iVar19].ly = pWVar49[iVar20].ly;
          pWVar1 = pWVar49 + iVar20;
          iVar21 = pWVar1->tx;
          iVar17 = pWVar1->ty;
          iVar23 = pWVar1->lx;
          pWVar2 = pWVar49 + iVar19;
          pWVar2->partNumber = pWVar1->partNumber;
          pWVar2->tx = iVar21;
          pWVar2->ty = iVar17;
          pWVar2->lx = iVar23;
          pWVar49[iVar20].ly = iVar16;
          pWVar1 = pWVar49 + iVar20;
          pWVar1->partNumber = local_1b8._0_4_;
          pWVar1->tx = local_1b8._4_4_;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&pWVar1->ty = uStack_1b0;
          uVar18 = (int)uVar42 - 1;
          uVar42 = (ulong)uVar18;
        } while (uVar18 != 0);
      }
      local_308 = ppWVar48;
      remove((char *)local_290[0]);
      plVar46 = local_290[0];
      pHVar12 = DAT_001e9d30;
      pHVar11 = (anonymous_namespace)::headers;
      iVar15 = Imf_3_4::globalThreadCount();
      Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
                ((MultiPartOutputFile *)local_2f8,(char *)plVar46,pHVar11,
                 (int)((ulong)((long)pHVar12 - (long)pHVar11) >> 3) * -0x49249249,false,iVar15);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Writing tasks ",0xe)
      ;
      std::ostream::flush();
      uVar42 = local_340;
      local_1b8 = (undefined1  [8])0x0;
      uStack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1a8 = (_Base_ptr)0x0;
      std::vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>::vector
                (&local_270,local_340,(allocator_type *)local_388);
      Imf_3_4::Array<Imf_3_4::Array2D<Imf_3_4::FrameBuffer>_>::Array(&local_2a8,uVar42);
      if (0 < (int)local_35c) {
        uVar42 = 0;
        do {
          if (*(int *)((anonymous_namespace)::partTypes + uVar42 * 4) == 0) {
            this_00 = (OutputPart *)operator_new(8);
            Imf_3_4::OutputPart::OutputPart(this_00,(MultiPartOutputFile *)local_2f8,(int)uVar42);
            local_388._0_8_ = this_00;
            std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                      ((vector<void*,std::allocator<void*>> *)local_1b8,(void **)local_388);
            setOutputFrameBuffer
                      (local_270.
                       super__Vector_base<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar42,
                       *(int *)((anonymous_namespace)::pixelTypes + uVar42 * 4),&local_358,
                       (Array2D<float> *)&local_2e8,&local_2c8,0xc5);
            Imf_3_4::OutputPart::setFrameBuffer((FrameBuffer *)this_00);
          }
          else {
            this = (TiledOutputPart *)operator_new(8);
            Imf_3_4::TiledOutputPart::TiledOutputPart
                      (this,(MultiPartOutputFile *)local_2f8,(int)uVar42);
            local_388._0_8_ = this;
            std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                      ((vector<void*,std::allocator<void*>> *)local_1b8,(void **)local_388);
            local_30c = Imf_3_4::TiledOutputPart::numXLevels();
            local_32c = Imf_3_4::TiledOutputPart::numYLevels();
            local_328 = (pointer)(long)(int)local_32c;
            local_368 = (pointer)(long)(int)local_30c;
            uVar41 = (long)local_328 * (long)local_368;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = uVar41;
            uVar28 = SUB168(auVar9 * ZEXT816(0x18),0);
            uVar51 = uVar28 + 8;
            if (0xfffffffffffffff7 < uVar28) {
              uVar51 = 0xffffffffffffffff;
            }
            if (SUB168(auVar9 * ZEXT816(0x18),8) != 0) {
              uVar51 = 0xffffffffffffffff;
            }
            puVar29 = (ulong *)operator_new__(uVar51);
            *puVar29 = uVar41;
            if (uVar41 != 0) {
              memset(puVar29 + 1,0,((uVar41 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
            }
            local_300 = uVar42 * 3;
            local_338 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                         *)(local_1d0 + uVar42 * 3);
            ppWVar48 = (local_338->_M_impl).super__Vector_impl_data._M_end_of_storage;
            if (ppWVar48 != (pointer)0x0) {
              pWVar49 = ppWVar48[-1];
              if (pWVar49 != (WritingTaskData *)0x0) {
                lVar50 = (long)pWVar49 * 0x18;
                do {
                  pvVar6 = *(void **)((long)(ppWVar48 + -1) + lVar50);
                  if (pvVar6 != (void *)0x0) {
                    operator_delete__(pvVar6);
                  }
                  lVar50 = lVar50 + -0x18;
                } while (lVar50 != 0);
              }
              operator_delete__(ppWVar48 + -1,(long)pWVar49 * 0x18 + 8);
            }
            (local_338->_M_impl).super__Vector_impl_data._M_start = local_328;
            (local_338->_M_impl).super__Vector_impl_data._M_finish = local_368;
            (local_338->_M_impl).super__Vector_impl_data._M_end_of_storage = (pointer)(puVar29 + 1);
            puVar29 = (ulong *)operator_new__(uVar51);
            *puVar29 = uVar41;
            if (uVar41 != 0) {
              memset(puVar29 + 1,0,((uVar41 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
            }
            local_320 = (ThreadPool *)(local_1d8 + local_300);
            uVar28 = *(ulong *)(local_320 + 0x10);
            if (uVar28 != 0) {
              lVar50 = *(long *)(uVar28 - 8);
              if (lVar50 != 0) {
                lVar45 = lVar50 * 0x18;
                do {
                  pvVar6 = *(void **)((long)(uVar28 - 8) + lVar45);
                  if (pvVar6 != (void *)0x0) {
                    operator_delete__(pvVar6);
                  }
                  lVar45 = lVar45 + -0x18;
                } while (lVar45 != 0);
              }
              operator_delete__((void *)(uVar28 - 8),lVar50 * 0x18 + 8);
            }
            *(pointer *)local_320 = local_328;
            *(pointer *)(local_320 + 8) = local_368;
            *(ulong **)(local_320 + 0x10) = puVar29 + 1;
            puVar29 = (ulong *)operator_new__(uVar51);
            *puVar29 = uVar41;
            if (uVar41 != 0) {
              memset(puVar29 + 1,0,((uVar41 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
            }
            puVar3 = local_1e0 + local_300;
            uVar28 = puVar3[2];
            if (uVar28 != 0) {
              lVar50 = *(long *)(uVar28 - 8);
              if (lVar50 != 0) {
                lVar45 = lVar50 * 0x18;
                do {
                  pvVar6 = *(void **)((long)(uVar28 - 8) + lVar45);
                  if (pvVar6 != (void *)0x0) {
                    operator_delete__(pvVar6);
                  }
                  lVar45 = lVar45 + -0x18;
                } while (lVar45 != 0);
              }
              operator_delete__((void *)(uVar28 - 8),lVar50 * 0x18 + 8);
            }
            auVar10._8_8_ = 0;
            auVar10._0_8_ = uVar41;
            uVar28 = SUB168(auVar10 * ZEXT816(0x30),0) | 8;
            *puVar3 = (ulong)local_328;
            puVar3[1] = (ulong)local_368;
            if (SUB168(auVar10 * ZEXT816(0x30),8) != 0) {
              uVar28 = 0xffffffffffffffff;
            }
            puVar3[2] = (ulong)(puVar29 + 1);
            plVar46 = &(local_2a8._data)->_sizeX + local_300;
            puVar29 = (ulong *)operator_new__(uVar28);
            *puVar29 = uVar41;
            if (uVar41 != 0) {
              lVar50 = uVar41 * 0x30;
              puVar38 = puVar29 + 2;
              do {
                *(undefined4 *)puVar38 = 0;
                puVar38[1] = 0;
                puVar38[2] = (ulong)puVar38;
                puVar38[3] = (ulong)puVar38;
                puVar38[4] = 0;
                puVar38 = puVar38 + 6;
                lVar50 = lVar50 + -0x30;
              } while (lVar50 != 0);
            }
            pFVar7 = (FrameBuffer *)plVar46[2];
            if (pFVar7 != (FrameBuffer *)0x0) {
              local_1e8 = pFVar7[-1]._map._M_t._M_impl.super__Rb_tree_header._M_node_count;
              if (local_1e8 != 0) {
                lVar50 = local_1e8 * 0x30;
                do {
                  std::
                  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                               *)(&pFVar7[-1]._map._M_t._M_impl.field_0x0 + lVar50));
                  lVar50 = lVar50 + -0x30;
                } while (lVar50 != 0);
              }
              operator_delete__(&pFVar7[-1]._map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                local_1e8 * 0x30 + 8);
            }
            *plVar46 = (long)local_328;
            plVar46[1] = (long)local_368;
            plVar46[2] = (long)(puVar29 + 1);
            if (0 < (int)local_368) {
              local_328 = (pointer)(ulong)local_30c;
              local_368 = (pointer)(ulong)local_32c;
              ppWVar48 = (pointer)0x0;
              do {
                if (0 < (int)local_32c) {
                  ppWVar52 = (pointer)0x0;
                  do {
                    iVar15 = (int)this;
                    cVar14 = Imf_3_4::TiledOutputPart::isValidLevel(iVar15,(int)ppWVar48);
                    if (cVar14 != '\0') {
                      iVar16 = Imf_3_4::TiledOutputPart::levelWidth(iVar15);
                      iVar21 = Imf_3_4::TiledOutputPart::levelHeight(iVar15);
                      lVar50 = (&(local_2a8._data)->_sizeY)[local_300];
                      pFVar7 = (&(local_2a8._data)->_data)[local_300];
                      iVar15 = *(int *)((anonymous_namespace)::pixelTypes + uVar42 * 4);
                      if (iVar15 == 0) {
                        fillPixels<unsigned_int>
                                  ((Array2D<unsigned_int> *)
                                   ((local_338->_M_impl).super__Vector_impl_data._M_end_of_storage +
                                   (long)(local_338->_M_impl).super__Vector_impl_data._M_finish *
                                   (long)ppWVar52 * 3 + (long)ppWVar48 * 3),iVar16,iVar21);
                      }
                      else if (iVar15 == 1) {
                        fillPixels<float>((Array2D<float> *)
                                          (*(ulong *)(local_320 + 8) * (long)ppWVar52 * 0x18 +
                                           *(ulong *)(local_320 + 0x10) + (long)ppWVar48 * 0x18),
                                          iVar16,iVar21);
                      }
                      else if (iVar15 == 2) {
                        fillPixels<Imath_3_2::half>
                                  ((Array2D<Imath_3_2::half> *)
                                   (puVar3[1] * (long)ppWVar52 * 0x18 + puVar3[2] +
                                   (long)ppWVar48 * 0x18),iVar16,iVar21);
                      }
                      setOutputFrameBuffer
                                (pFVar7 + (long)(lVar50 * (long)ppWVar52 + (long)ppWVar48),
                                 *(int *)((anonymous_namespace)::pixelTypes + uVar42 * 4),
                                 (Array2D<unsigned_int> *)
                                 ((local_338->_M_impl).super__Vector_impl_data._M_end_of_storage +
                                 (long)(local_338->_M_impl).super__Vector_impl_data._M_finish *
                                 (long)ppWVar52 * 3 + (long)ppWVar48 * 3),
                                 (Array2D<float> *)
                                 (*(ulong *)(local_320 + 8) * (long)ppWVar52 * 0x18 +
                                  *(ulong *)(local_320 + 0x10) + (long)ppWVar48 * 0x18),
                                 (Array2D<Imath_3_2::half> *)
                                 (puVar3[1] * (long)ppWVar52 * 0x18 + puVar3[2] +
                                 (long)ppWVar48 * 0x18),iVar16);
                    }
                    ppWVar52 = (pointer)((long)ppWVar52 + 1);
                  } while (local_368 != ppWVar52);
                }
                ppWVar48 = (pointer)((long)ppWVar48 + 1);
              } while (ppWVar48 != local_328);
            }
          }
          uVar42 = uVar42 + 1;
        } while (uVar42 != local_340);
      }
      pTVar30 = (ThreadPool *)operator_new(0x10);
      IlmThread_3_4::ThreadPool::ThreadPool(pTVar30,0x20);
      IlmThread_3_4::TaskGroup::TaskGroup((TaskGroup *)local_318);
      local_388._0_8_ = (pointer)0x0;
      local_388._8_8_ = (pointer)0x0;
      local_378 = (pointer)0x0;
      local_320 = pTVar30;
      if (0 < (int)(uint)local_308) {
        local_3a0 = (pointer)0x0;
        uVar18 = (uint)local_308 - 1;
        local_308 = (pointer)-(ulong)((uint)local_308 & 0x7fffffff);
        local_368 = (pointer)-(ulong)uVar18;
        uVar42 = 0;
        ppWVar48 = (pointer)0x0;
        pWVar49 = local_228;
        do {
          ppWVar52 = local_378;
          if ((pointer)local_388._8_8_ == local_378) {
            sVar53 = local_388._8_8_ - (long)local_3a0;
            if (sVar53 == 0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar41 = (long)sVar53 >> 3;
            uVar28 = 1;
            if ((pointer)local_388._8_8_ != local_3a0) {
              uVar28 = uVar41;
            }
            p_Var39 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                       *)(uVar28 + uVar41);
            if ((_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                 *)0xffffffffffffffe < p_Var39) {
              p_Var39 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                         *)0xfffffffffffffff;
            }
            local_338 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                         *)0xfffffffffffffff;
            if (!CARRY8(uVar28,uVar41)) {
              local_338 = p_Var39;
            }
            __dest = std::
                     _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                     ::_M_allocate(local_338,(size_t)local_338);
            *(WritingTaskData **)((long)__dest + sVar53) = pWVar49;
            if (0 < (long)sVar53) {
              memmove(__dest,local_3a0,sVar53);
            }
            if (local_3a0 != (pointer)0x0) {
              operator_delete(local_3a0,(long)ppWVar52 - (long)local_3a0);
            }
            local_388._8_8_ = sVar53 + (long)__dest;
            local_378 = __dest + (long)local_338;
            local_3a0 = __dest;
            local_388._0_8_ = __dest;
          }
          else {
            *(WritingTaskData **)local_388._8_8_ = pWVar49;
          }
          local_388._8_8_ = local_388._8_8_ + 8;
          if (((int)(uVar42 / 10) * -10 == (int)ppWVar48) || (local_368 == ppWVar48)) {
            pTVar31 = (Task *)operator_new(0x38);
            std::
            vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
            ::vector(&local_210,
                     (vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                      *)local_388);
            pAVar13 = local_2a8._data;
            IlmThread_3_4::Task::Task(pTVar31,(TaskGroup *)local_318);
            *(undefined ***)pTVar31 = &PTR__WritingTask_001e6268;
            *(int ***)(pTVar31 + 0x10) = local_2f8;
            std::
            vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
            ::vector((vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                      *)(pTVar31 + 0x18),&local_210);
            *(Array2D<Imf_3_4::FrameBuffer> **)(pTVar31 + 0x30) = pAVar13;
            IlmThread_3_4::ThreadPool::addTask((Task *)local_320);
            if (local_210.
                super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_210.
                              super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_210.
                                    super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_210.
                                    super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            local_388._8_8_ = local_3a0;
          }
          ppWVar48 = (pointer)((long)ppWVar48 - 1);
          uVar42 = (ulong)((int)uVar42 + 1);
          pWVar49 = pWVar49 + 1;
        } while (local_308 != ppWVar48);
      }
      if ((pointer)local_388._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_388._0_8_,(long)local_378 - local_388._0_8_);
      }
      IlmThread_3_4::TaskGroup::~TaskGroup((TaskGroup *)local_318);
      psVar44 = local_298;
      if (0 < (int)local_35c) {
        uVar42 = 0;
        do {
          pvVar6 = *(void **)((long)local_1b8 + uVar42 * 8);
          if (pvVar6 != (void *)0x0) {
            operator_delete(pvVar6,8);
          }
          uVar42 = uVar42 + 1;
        } while (local_340 != uVar42);
      }
      (**(code **)(*(ulong *)local_320 + 8))();
      sVar40 = *psVar44;
      if (sVar40 != 0) {
        psVar44 = local_298 + sVar40 * 3 + 1;
        do {
          sVar8 = psVar44[-1];
          if (sVar8 != 0) {
            lVar50 = *(long *)(sVar8 - 8);
            if (lVar50 != 0) {
              lVar45 = lVar50 * 0x18;
              do {
                pvVar6 = *(void **)((long)(sVar8 - 8) + lVar45);
                if (pvVar6 != (void *)0x0) {
                  operator_delete__(pvVar6);
                }
                lVar45 = lVar45 + -0x18;
              } while (lVar45 != 0);
            }
            operator_delete__((void *)(sVar8 - 8),lVar50 * 0x18 + 8);
          }
          psVar44 = psVar44 + -3;
        } while (psVar44 != local_1e0);
      }
      operator_delete__(local_298,sVar40 * 0x18 + 8);
      sVar40 = *local_1f8;
      psVar44 = local_1f8;
      if (sVar40 != 0) {
        psVar47 = local_1f8 + sVar40 * 3 + 1;
        do {
          sVar8 = psVar47[-1];
          if (sVar8 != 0) {
            lVar50 = *(long *)(sVar8 - 8);
            if (lVar50 != 0) {
              lVar45 = lVar50 * 0x18;
              do {
                pvVar6 = *(void **)((long)(sVar8 - 8) + lVar45);
                if (pvVar6 != (void *)0x0) {
                  operator_delete__(pvVar6);
                }
                lVar45 = lVar45 + -0x18;
              } while (lVar45 != 0);
            }
            operator_delete__((void *)(sVar8 - 8),lVar50 * 0x18 + 8);
            psVar44 = local_1f8;
          }
          psVar47 = psVar47 + -3;
        } while (psVar47 != local_1d0);
      }
      operator_delete__(psVar44,sVar40 * 0x18 + 8);
      sVar40 = *local_1f0;
      psVar44 = local_1f0;
      if (sVar40 != 0) {
        psVar47 = local_1f0 + sVar40 * 3 + 1;
        do {
          sVar8 = psVar47[-1];
          if (sVar8 != 0) {
            lVar50 = *(long *)(sVar8 - 8);
            if (lVar50 != 0) {
              lVar45 = lVar50 * 0x18;
              do {
                pvVar6 = *(void **)((long)(sVar8 - 8) + lVar45);
                if (pvVar6 != (void *)0x0) {
                  operator_delete__(pvVar6);
                }
                lVar45 = lVar45 + -0x18;
              } while (lVar45 != 0);
            }
            operator_delete__((void *)(sVar8 - 8),lVar50 * 0x18 + 8);
            psVar44 = local_1f0;
          }
          psVar47 = psVar47 + -3;
        } while (psVar47 != local_1d8);
      }
      operator_delete__(psVar44,sVar40 * 0x18 + 8);
      Imf_3_4::Array<Imf_3_4::Array2D<Imf_3_4::FrameBuffer>_>::~Array(&local_2a8);
      std::vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>::~vector(&local_270);
      if (local_1b8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1b8,(long)local_1a8 - (long)local_1b8);
      }
      Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)local_2f8);
      if (local_228 != (WritingTaskData *)0x0) {
        operator_delete(local_228,local_218 - (long)local_228);
      }
      if (local_358._data != (uint *)0x0) {
        operator_delete__(local_358._data);
      }
      if (local_2e8._data != (half *)0x0) {
        operator_delete__(local_2e8._data);
      }
      if (local_2c8._data != (half *)0x0) {
        operator_delete__(local_2c8._data);
      }
      plVar46 = local_290[0];
      local_378 = (pointer)0x0;
      local_388._0_8_ = (TiledOutputPart *)0x0;
      local_388._8_8_ = (pointer)0x0;
      local_2c8._data = (half *)0x0;
      local_2c8._sizeX = 0;
      local_2c8._sizeY = 0;
      local_2e8._data = (half *)0x0;
      local_2e8._sizeX = 0;
      local_2e8._sizeY = 0;
      iVar15 = Imf_3_4::globalThreadCount();
      uVar42 = 1;
      Imf_3_4::MultiPartInputFile::MultiPartInputFile
                ((MultiPartInputFile *)&local_270,(char *)plVar46,iVar15,true);
      uVar28 = 0;
      while( true ) {
        uVar22 = (undefined4)uVar42;
        iVar15 = Imf_3_4::MultiPartInputFile::parts();
        if ((ulong)(long)iVar15 <= uVar28) break;
        Imf_3_4::MultiPartInputFile::header((int)&local_270);
        puVar32 = (undefined8 *)Imf_3_4::Header::displayWindow();
        puVar33 = (undefined8 *)Imf_3_4::Header::displayWindow();
        iVar15 = -(uint)((int)*puVar33 == (int)*puVar32);
        iVar16 = -(uint)((int)((ulong)*puVar33 >> 0x20) == (int)((ulong)*puVar32 >> 0x20));
        auVar55._4_4_ = iVar15;
        auVar55._0_4_ = iVar15;
        auVar55._8_4_ = iVar16;
        auVar55._12_4_ = iVar16;
        iVar15 = movmskpd(uVar22,auVar55);
        if ((iVar15 != 3) ||
           (iVar16 = -(uint)((int)puVar33[1] == (int)puVar32[1]),
           iVar21 = -(uint)((int)((ulong)puVar33[1] >> 0x20) == (int)((ulong)puVar32[1] >> 0x20)),
           auVar56._4_4_ = iVar16, auVar56._0_4_ = iVar16, auVar56._8_4_ = iVar21,
           auVar56._12_4_ = iVar21, iVar16 = movmskpd((int)puVar33,auVar56), iVar16 != 3)) {
          __assert_fail("header.displayWindow () == headers[i].displayWindow ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x297,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        puVar32 = (undefined8 *)Imf_3_4::Header::dataWindow();
        puVar33 = (undefined8 *)Imf_3_4::Header::dataWindow();
        iVar16 = -(uint)((int)*puVar33 == (int)*puVar32);
        iVar21 = -(uint)((int)((ulong)*puVar33 >> 0x20) == (int)((ulong)*puVar32 >> 0x20));
        auVar57._4_4_ = iVar16;
        auVar57._0_4_ = iVar16;
        auVar57._8_4_ = iVar21;
        auVar57._12_4_ = iVar21;
        uVar18 = movmskpd(iVar15,auVar57);
        uVar42 = (ulong)uVar18;
        if ((uVar18 != 3) ||
           (iVar15 = -(uint)((int)puVar33[1] == (int)puVar32[1]),
           iVar16 = -(uint)((int)((ulong)puVar33[1] >> 0x20) == (int)((ulong)puVar32[1] >> 0x20)),
           auVar58._4_4_ = iVar15, auVar58._0_4_ = iVar15, auVar58._8_4_ = iVar16,
           auVar58._12_4_ = iVar16, iVar15 = movmskpd((int)puVar33,auVar58), iVar15 != 3)) {
          __assert_fail("header.dataWindow () == headers[i].dataWindow ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x298,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pfVar34 = (float *)Imf_3_4::Header::pixelAspectRatio();
        fVar4 = *pfVar34;
        pfVar34 = (float *)Imf_3_4::Header::pixelAspectRatio();
        if ((fVar4 != *pfVar34) || (NAN(fVar4) || NAN(*pfVar34))) {
          __assert_fail("header.pixelAspectRatio () == headers[i].pixelAspectRatio ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x299,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pfVar34 = (float *)Imf_3_4::Header::screenWindowCenter();
        pfVar35 = (float *)Imf_3_4::Header::screenWindowCenter();
        if ((((*pfVar34 != *pfVar35) || (NAN(*pfVar34) || NAN(*pfVar35))) ||
            (pfVar34[1] != pfVar35[1])) || (NAN(pfVar34[1]) || NAN(pfVar35[1]))) {
          __assert_fail("header.screenWindowCenter () == headers[i].screenWindowCenter ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x29b,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pfVar34 = (float *)Imf_3_4::Header::screenWindowWidth();
        fVar4 = *pfVar34;
        pfVar34 = (float *)Imf_3_4::Header::screenWindowWidth();
        if ((fVar4 != *pfVar34) || (NAN(fVar4) || NAN(*pfVar34))) {
          __assert_fail("header.screenWindowWidth () == headers[i].screenWindowWidth ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x29c,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        piVar36 = (int *)Imf_3_4::Header::lineOrder();
        iVar15 = *piVar36;
        piVar36 = (int *)Imf_3_4::Header::lineOrder();
        if (iVar15 != *piVar36) {
          __assert_fail("header.lineOrder () == headers[i].lineOrder ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x29d,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        piVar36 = (int *)Imf_3_4::Header::compression();
        iVar15 = *piVar36;
        piVar36 = (int *)Imf_3_4::Header::compression();
        if (iVar15 != *piVar36) {
          __assert_fail("header.compression () == headers[i].compression ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x29e,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        Imf_3_4::Header::channels();
        lVar50 = Imf_3_4::ChannelList::begin();
        Imf_3_4::Header::channels();
        lVar45 = Imf_3_4::ChannelList::begin();
        local_1b8 = *(undefined1 (*) [8])(lVar50 + 0x120);
        uStack_1b0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar50 + 0x128);
        local_358._sizeX = *(long *)(lVar45 + 0x120);
        local_358._sizeY = *(long *)(lVar45 + 0x128);
        cVar14 = Imf_3_4::Channel::operator==((Channel *)local_1b8,(Channel *)&local_358);
        if (cVar14 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," type ",6);
          poVar25 = (ostream *)std::ostream::operator<<(&std::cout,local_1b8._0_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar25,", ",2);
          poVar25 = (ostream *)std::ostream::operator<<(poVar25,(int)local_358._sizeX);
          std::__ostream_insert<char,std::char_traits<char>>(poVar25," xSampling ",0xb);
          poVar25 = (ostream *)std::ostream::operator<<(poVar25,local_1b8._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar25,", ",2);
          poVar25 = (ostream *)std::ostream::operator<<(poVar25,local_358._sizeX._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar25," ySampling ",0xb);
          poVar25 = (ostream *)std::ostream::operator<<(poVar25,(_Rb_tree_color)uStack_1b0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar25,", ",2);
          poVar25 = (ostream *)std::ostream::operator<<(poVar25,(int)local_358._sizeY);
          std::__ostream_insert<char,std::char_traits<char>>(poVar25," pLinear ",9);
          poVar25 = std::ostream::_M_insert<bool>(SUB81(poVar25,0));
          std::__ostream_insert<char,std::char_traits<char>>(poVar25,", ",2);
          std::ostream::_M_insert<bool>(SUB81(poVar25,0));
          std::ostream::flush();
        }
        this_01 = (ChannelList *)Imf_3_4::Header::channels();
        pCVar37 = (ChannelList *)Imf_3_4::Header::channels();
        cVar14 = Imf_3_4::ChannelList::operator==(this_01,pCVar37);
        if (cVar14 == '\0') {
          __assert_fail("header.channels () == headers[i].channels ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x2af,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        puVar32 = (undefined8 *)Imf_3_4::Header::name_abi_cxx11_();
        puVar33 = (undefined8 *)Imf_3_4::Header::name_abi_cxx11_();
        sVar53 = puVar32[1];
        if ((sVar53 != puVar33[1]) ||
           ((sVar53 != 0 && (iVar15 = bcmp((void *)*puVar32,(void *)*puVar33,sVar53), iVar15 != 0)))
           ) {
          __assert_fail("header.name () == headers[i].name ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x2b0,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        puVar32 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
        puVar33 = (undefined8 *)Imf_3_4::Header::type_abi_cxx11_();
        sVar53 = puVar32[1];
        if ((sVar53 != puVar33[1]) ||
           ((sVar53 != 0 && (iVar15 = bcmp((void *)*puVar32,(void *)*puVar33,sVar53), iVar15 != 0)))
           ) {
          __assert_fail("header.type () == headers[i].type ()",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x2b1,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        uVar28 = uVar28 + 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Reading whole files ",0x14);
      std::ostream::flush();
      local_358._sizeX = 0;
      local_358._sizeY = 0;
      local_358._data = (uint *)0x0;
      uVar42 = ((long)DAT_001e9d30 - (long)(anonymous_namespace)::headers >> 3) * 0x6db6db6db6db6db7
      ;
      local_1b8 = (undefined1  [8])((ulong)local_1b8 & 0xffffffff00000000);
      uVar18 = (uint)uVar42;
      if ((int)uVar18 < 1) {
LAB_0017f500:
        if (0 < (int)uVar18) {
          p_Var39 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                     *)0x0;
          do {
            iVar15 = *(int *)(local_358._sizeX + (long)p_Var39 * 4);
            lVar50 = (long)iVar15;
            iVar16 = (int)(TiledInputPart *)&local_228;
            local_338 = p_Var39;
            if (*(int *)((anonymous_namespace)::partTypes + lVar50 * 4) == 0) {
              uStack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           ((ulong)uStack_1b0._4_4_ << 0x20);
              local_1a8 = (_Base_ptr)0x0;
              local_1a0 = (_Base_ptr)&uStack_1b0;
              local_190 = 0;
              local_198 = local_1a0;
              setInputFrameBuffer((FrameBuffer *)local_1b8,
                                  *(int *)((anonymous_namespace)::pixelTypes + lVar50 * 4),
                                  (Array2D<unsigned_int> *)local_388,(Array2D<float> *)&local_2c8,
                                  &local_2e8,0xc5,0x107);
              Imf_3_4::InputPart::InputPart
                        ((InputPart *)&local_228,(MultiPartInputFile *)&local_270,iVar15);
              Imf_3_4::InputPart::setFrameBuffer((FrameBuffer *)&local_228);
              Imf_3_4::InputPart::readPixels(iVar16,0);
              iVar15 = *(int *)((anonymous_namespace)::pixelTypes + lVar50 * 4);
              if (iVar15 == 0) {
                bVar54 = checkPixels<unsigned_int>
                                   ((Array2D<unsigned_int> *)local_388,0,0xc4,0,0x106,0xc5);
                if (!bVar54) {
                  __assert_fail("checkPixels<unsigned int> (uData, width, height)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                ,0x2e1,
                                "void (anonymous namespace)::readWholeFiles(const std::string &)");
                }
              }
              else if (iVar15 == 1) {
                bVar54 = checkPixels<float>((Array2D<float> *)&local_2c8,0,0xc4,0,0x106,0xc5);
                if (!bVar54) {
                  __assert_fail("checkPixels<float> (fData, width, height)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                ,0x2e4,
                                "void (anonymous namespace)::readWholeFiles(const std::string &)");
                }
              }
              else if ((iVar15 == 2) &&
                      (bVar54 = checkPixels<Imath_3_2::half>(&local_2e8,0,0xc4,0,0x106,0xc5),
                      !bVar54)) {
                __assert_fail("checkPixels<half> (hData, width, height)",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                              ,0x2e7,
                              "void (anonymous namespace)::readWholeFiles(const std::string &)");
              }
            }
            else {
              uStack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           ((ulong)uStack_1b0._4_4_ << 0x20);
              local_1a8 = (_Base_ptr)0x0;
              local_1a0 = (_Base_ptr)&uStack_1b0;
              local_190 = 0;
              local_198 = local_1a0;
              Imf_3_4::TiledInputPart::TiledInputPart
                        ((TiledInputPart *)&local_228,(MultiPartInputFile *)&local_270,iVar15);
              uVar22 = Imf_3_4::TiledInputPart::numXLevels();
              local_368 = (pointer)CONCAT44(local_368._4_4_,uVar22);
              iVar15 = Imf_3_4::TiledInputPart::numYLevels();
              if (0 < (int)local_368) {
                iVar21 = 0;
                do {
                  if (0 < iVar15) {
                    iVar17 = 0;
                    do {
                      cVar14 = Imf_3_4::TiledInputPart::isValidLevel(iVar16,iVar21);
                      if (cVar14 != '\0') {
                        iVar19 = Imf_3_4::TiledInputPart::levelWidth(iVar16);
                        iVar20 = Imf_3_4::TiledInputPart::levelHeight(iVar16);
                        setInputFrameBuffer((FrameBuffer *)local_1b8,
                                            *(int *)((anonymous_namespace)::pixelTypes + lVar50 * 4)
                                            ,(Array2D<unsigned_int> *)local_388,
                                            (Array2D<float> *)&local_2c8,&local_2e8,0xc5,0x107);
                        Imf_3_4::TiledInputPart::setFrameBuffer((FrameBuffer *)&local_228);
                        iVar23 = Imf_3_4::TiledInputPart::numXTiles(iVar16);
                        iVar24 = Imf_3_4::TiledInputPart::numYTiles(iVar16);
                        Imf_3_4::TiledInputPart::readTiles
                                  (iVar16,0,iVar23 + -1,0,iVar24 + -1,iVar21);
                        iVar23 = *(int *)((anonymous_namespace)::pixelTypes + lVar50 * 4);
                        if (iVar23 == 0) {
                          bVar54 = checkPixels<unsigned_int>
                                             ((Array2D<unsigned_int> *)local_388,0,iVar19 + -1,0,
                                              iVar20 + -1,iVar19);
                          if (!bVar54) {
                            __assert_fail("checkPixels<unsigned int> (uData, w, h)",
                                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                          ,0x30b,
                                          "void (anonymous namespace)::readWholeFiles(const std::string &)"
                                         );
                          }
                        }
                        else if (iVar23 == 1) {
                          bVar54 = checkPixels<float>((Array2D<float> *)&local_2c8,0,iVar19 + -1,0,
                                                      iVar20 + -1,iVar19);
                          if (!bVar54) {
                            __assert_fail("checkPixels<float> (fData, w, h)",
                                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                          ,0x30e,
                                          "void (anonymous namespace)::readWholeFiles(const std::string &)"
                                         );
                          }
                        }
                        else if ((iVar23 == 2) &&
                                (bVar54 = checkPixels<Imath_3_2::half>
                                                    (&local_2e8,0,iVar19 + -1,0,iVar20 + -1,iVar19),
                                !bVar54)) {
                          __assert_fail("checkPixels<half> (hData, w, h)",
                                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                        ,0x311,
                                        "void (anonymous namespace)::readWholeFiles(const std::string &)"
                                       );
                        }
                      }
                      iVar17 = iVar17 + 1;
                    } while (iVar15 != iVar17);
                  }
                  iVar21 = iVar21 + 1;
                } while (iVar21 != (int)local_368);
              }
            }
            std::
            _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
            ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                         *)local_1b8);
            p_Var39 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                       *)((long)&(local_338->_M_impl).super__Vector_impl_data._M_start + 1);
          } while (p_Var39 !=
                   (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                    *)(ulong)(uVar18 & 0x7fffffff));
        }
      }
      else {
        iVar15 = 0;
        do {
          if ((uint *)local_358._sizeY == local_358._data) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_358,(iterator)local_358._sizeY,
                       (int *)local_1b8);
          }
          else {
            *(int *)local_358._sizeY = iVar15;
            local_358._sizeY = local_358._sizeY + 4;
          }
          iVar15 = local_1b8._0_4_ + 1;
          local_1b8._0_4_ = iVar15;
        } while (iVar15 < (int)uVar18);
        uVar42 = uVar42 & 0xffffffff;
        if (0 < (int)uVar18) {
          do {
            iVar15 = random_int(uVar18);
            iVar16 = random_int(uVar18);
            uVar22 = *(undefined4 *)(local_358._sizeX + (long)iVar15 * 4);
            *(undefined4 *)(local_358._sizeX + (long)iVar15 * 4) =
                 *(undefined4 *)(local_358._sizeX + (long)iVar16 * 4);
            *(undefined4 *)(local_358._sizeX + (long)iVar16 * 4) = uVar22;
            uVar43 = (int)uVar42 - 1;
            uVar42 = (ulong)uVar43;
          } while (uVar43 != 0);
          goto LAB_0017f500;
        }
      }
      if ((void *)local_358._sizeX != (void *)0x0) {
        operator_delete((void *)local_358._sizeX,(long)local_358._data - local_358._sizeX);
      }
      if (local_258 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_258);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_270.super__Vector_base<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_270.
                   super__Vector_base<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_2e8._data != (half *)0x0) {
        operator_delete__(local_2e8._data);
      }
      if (local_2c8._data != (half *)0x0) {
        operator_delete__(local_2c8._data);
      }
      if (local_378 != (pointer)0x0) {
        operator_delete__(local_378);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Reading partial files ",0x16);
      std::ostream::flush();
      plVar46 = local_290[0];
      iVar15 = Imf_3_4::globalThreadCount();
      Imf_3_4::MultiPartInputFile::MultiPartInputFile
                ((MultiPartInputFile *)local_1b8,(char *)plVar46,iVar15,true);
      IlmThread_3_4::TaskGroup::TaskGroup((TaskGroup *)&local_270);
      pTVar30 = (ThreadPool *)operator_new(0x10);
      IlmThread_3_4::ThreadPool::ThreadPool(pTVar30,0x20);
      iVar15 = local_230;
      if (0 < local_230) {
        do {
          pTVar31 = (Task *)operator_new(0x18);
          IlmThread_3_4::Task::Task(pTVar31,(TaskGroup *)&local_270);
          *(undefined ***)pTVar31 = &PTR__Task_001e62a8;
          *(undefined1 **)(pTVar31 + 0x10) = local_1b8;
          IlmThread_3_4::ThreadPool::addTask((Task *)pTVar30);
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
      (**(code **)(*(long *)pTVar30 + 8))(pTVar30);
      IlmThread_3_4::TaskGroup::~TaskGroup((TaskGroup *)&local_270);
      if (local_1a0 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0);
      }
      if (uStack_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(uStack_1b0);
      }
      remove((char *)local_290[0]);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      iVar15 = local_22c;
      std::ostream::put(-0x60);
      std::ostream::flush();
      std::ostream::flush();
      iVar15 = iVar15 + 1;
    } while (iVar15 != local_234);
  }
  if (local_290[0] != local_280) {
    operator_delete(local_290[0],local_280[0] + 1);
  }
  return;
}

Assistant:

void
testWriteRead (
    int                partNumber,
    int                runCount,
    int                randomReadCount,
    const std::string& tempDir)
{
    cout << "Testing file with " << partNumber << " part(s)." << endl << flush;

    std::string fn = tempDir + "imf_test_multipart_mixing_basic.exr";

    for (int i = 0; i < runCount; i++)
    {
        generateRandomFile (partNumber, fn);
        readWholeFiles (fn);
        readFirstPart (fn);
        readPartialFiles (randomReadCount, fn);
        killOffsetTables (fn);
        readFirstPart (fn);
        readWholeFiles (fn);

        remove (fn.c_str ());
        cout << endl << flush;
    }
}